

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

light_pcapng_file_info *
light_create_file_info(char *os_desc,char *hardware_desc,char *user_app_desc,char *file_comment)

{
  light_pcapng_file_info *plVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t comment_len;
  size_t app_len;
  size_t hw_len;
  size_t os_len;
  light_pcapng_file_info *info;
  
  plVar1 = light_create_default_file_info();
  if (in_RDI != (char *)0x0) {
    sVar2 = strlen(in_RDI);
    if (sVar2 != 0) {
      sVar2 = strlen(in_RDI);
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->os_desc = pcVar3;
      memcpy(plVar1->os_desc,in_RDI,sVar2);
      plVar1->os_desc_size = sVar2;
    }
  }
  if (in_RSI != (char *)0x0) {
    sVar2 = strlen(in_RSI);
    if (sVar2 != 0) {
      sVar2 = strlen(in_RSI);
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->hardware_desc = pcVar3;
      memcpy(plVar1->hardware_desc,in_RSI,sVar2);
      plVar1->hardware_desc_size = sVar2;
    }
  }
  if (in_RDX != (char *)0x0) {
    sVar2 = strlen(in_RDX);
    if (sVar2 != 0) {
      sVar2 = strlen(in_RDX);
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->user_app_desc = pcVar3;
      memcpy(plVar1->user_app_desc,in_RDX,sVar2);
      plVar1->user_app_desc_size = sVar2;
    }
  }
  if (in_RCX != (char *)0x0) {
    sVar2 = strlen(in_RCX);
    if (sVar2 != 0) {
      sVar2 = strlen(in_RCX);
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->file_comment = pcVar3;
      memcpy(plVar1->file_comment,in_RCX,sVar2);
      plVar1->file_comment_size = sVar2;
    }
  }
  return plVar1;
}

Assistant:

light_pcapng_file_info *light_create_file_info(const char *os_desc, const char *hardware_desc, const char *user_app_desc, const char *file_comment)
{
	light_pcapng_file_info *info = light_create_default_file_info();

	if (os_desc != NULL && strlen(os_desc) > 0)
	{
		size_t os_len = strlen(os_desc);
		info->os_desc = calloc(os_len, sizeof(char));
		memcpy(info->os_desc, os_desc, os_len);
		info->os_desc_size = os_len;
	}

	if (hardware_desc != NULL && strlen(hardware_desc) > 0)
	{
		size_t hw_len = strlen(hardware_desc);
		info->hardware_desc = calloc(hw_len, sizeof(char));
		memcpy(info->hardware_desc, hardware_desc, hw_len);
		info->hardware_desc_size = hw_len;
	}

	if (user_app_desc != NULL && strlen(user_app_desc) > 0)
	{
		size_t app_len = strlen(user_app_desc);
		info->user_app_desc = calloc(app_len, sizeof(char));
		memcpy(info->user_app_desc, user_app_desc, app_len);
		info->user_app_desc_size = app_len;
	}

	if (file_comment != NULL && strlen(file_comment) > 0)
	{
		size_t comment_len = strlen(file_comment);
		info->file_comment = calloc(comment_len, sizeof(char));
		memcpy(info->file_comment, file_comment, comment_len);
		info->file_comment_size = comment_len;
	}

	return info;
}